

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

int __thiscall MutableS2ShapeIndex::GetEdgeMaxLevel(MutableS2ShapeIndex *this,Edge *edge)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = (edge->v0).c_[1] - (edge->v1).c_[1];
  dVar2 = (edge->v0).c_[0] - (edge->v1).c_[0];
  dVar3 = (edge->v0).c_[2] - (edge->v1).c_[2];
  iVar1 = S2::Metric<1>::GetLevelForMaxValue
                    ((Metric<1> *)&S2::kAvgEdge,
                     SQRT(dVar3 * dVar3 + dVar4 * dVar4 + dVar2 * dVar2) *
                     FLAGS_s2shape_index_cell_size_to_long_edge_ratio);
  return iVar1;
}

Assistant:

D operator-(const D& b) const { return D(AsD()) -= b; }